

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

double var(double *vec,int N)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar2 = 0.0;
  dVar3 = 0.0;
  if (0 < N) {
    uVar1 = 0;
    do {
      dVar3 = dVar3 + vec[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  if (0 < N) {
    dVar2 = 0.0;
    uVar1 = 0;
    do {
      dVar4 = vec[uVar1] - dVar3 / (double)N;
      dVar2 = dVar2 + dVar4 * dVar4;
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  return dVar2 / (double)N;
}

Assistant:

double var(double* vec, int N) {
	double v,temp,m;
	int i;
	v = 0.0;	
	m = mean(vec,N);
	
	for (i = 0; i < N; ++i) {
		temp = vec[i] - m;
		v+= temp*temp;
	}
	
	v = v / N;
	
	return v;
	
}